

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

int __thiscall ON_BrepTrim::EdgeCurveIndexOf(ON_BrepTrim *this)

{
  int iVar1;
  int iVar2;
  ON_BrepEdge *pOVar3;
  int local_14;
  int c3i;
  ON_BrepTrim *this_local;
  
  local_14 = -1;
  if (((this->m_brep != (ON_Brep *)0x0) && (-1 < this->m_ei)) &&
     (iVar2 = this->m_ei,
     iVar1 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_brep->m_E),
     iVar2 < iVar1)) {
    pOVar3 = ON_ClassArray<ON_BrepEdge>::operator[]
                       ((ON_ClassArray<ON_BrepEdge> *)&this->m_brep->m_E,this->m_ei);
    local_14 = pOVar3->m_c3i;
    if ((local_14 < 0) ||
       (iVar2 = ON_SimpleArray<ON_Curve_*>::Count
                          (&(this->m_brep->m_C3).super_ON_SimpleArray<ON_Curve_*>),
       iVar2 <= local_14)) {
      local_14 = -1;
    }
  }
  return local_14;
}

Assistant:

int ON_BrepTrim::EdgeCurveIndexOf() const
{
  int c3i = -1;
  if ( m_brep && m_ei >= 0 && m_ei < m_brep->m_E.Count() )
  {
    c3i = m_brep->m_E[m_ei].m_c3i;
    if ( c3i < 0 || c3i >= m_brep->m_C3.Count() )
      c3i = -1;
  }
  return c3i;
}